

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueSymbol.cpp
# Opt level: O0

void __thiscall
slang::ast::ValueDriver::ValueDriver
          (ValueDriver *this,DriverKind kind,Expression *longestStaticPrefix,
          Symbol *containingSymbol,bitmask<slang::ast::AssignFlags> flags)

{
  ProceduralBlockSymbol *pPVar1;
  Symbol *in_RCX;
  undefined1 in_SIL;
  not_null<const_slang::ast::Expression_*> *in_RDI;
  undefined1 in_R8B;
  Symbol *local_38;
  Expression *local_30;
  Symbol *local_28;
  undefined1 local_11;
  undefined1 local_1;
  
  local_28 = in_RCX;
  local_11 = in_SIL;
  local_1 = in_R8B;
  not_null<const_slang::ast::Expression_*>::not_null<const_slang::ast::Expression_*>
            (in_RDI,&local_30);
  local_38 = local_28;
  not_null<const_slang::ast::Symbol_*>::not_null<const_slang::ast::Symbol_*>
            ((not_null<const_slang::ast::Symbol_*> *)(in_RDI + 1),&local_38);
  in_RDI[2].ptr = (Expression *)0x0;
  *(undefined1 *)&in_RDI[3].ptr = local_1;
  *(undefined1 *)((long)&in_RDI[3].ptr + 1) = local_11;
  *(undefined1 *)((long)&in_RDI[3].ptr + 3) = 0;
  if (local_28->kind == ProceduralBlock) {
    pPVar1 = Symbol::as<slang::ast::ProceduralBlockSymbol>((Symbol *)0x7ef5df);
    *(char *)((long)&in_RDI[3].ptr + 2) = (char)pPVar1->procedureKind;
  }
  else if (local_28->kind == Subroutine) {
    *(undefined1 *)((long)&in_RDI[3].ptr + 2) = 6;
  }
  else {
    *(undefined1 *)((long)&in_RDI[3].ptr + 2) = 7;
  }
  return;
}

Assistant:

ValueDriver::ValueDriver(DriverKind kind, const Expression& longestStaticPrefix,
                         const Symbol& containingSymbol, bitmask<AssignFlags> flags) :
    prefixExpression(&longestStaticPrefix), containingSymbol(&containingSymbol), flags(flags),
    kind(kind) {

    if (containingSymbol.kind == SymbolKind::ProceduralBlock) {
        source = static_cast<DriverSource>(
            containingSymbol.as<ProceduralBlockSymbol>().procedureKind);
    }
    else if (containingSymbol.kind == SymbolKind::Subroutine) {
        source = DriverSource::Subroutine;
    }
    else {
        source = DriverSource::Other;
    }
}